

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

void __thiscall VCClusterAniso::delItemAdditionalAct(VCClusterAniso *this,VCFace *f)

{
  undefined1 local_70 [8];
  Matrix3d *local_68;
  Matrix3d *local_48;
  Vector3d *local_40;
  
  local_70 = (undefined1  [8])&this->sumK;
  local_68 = &f->K;
  Eigen::internal::
  assign_LinearTraversal_CompleteUnrolling<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0,_9>
  ::run((Matrix<double,_3,_3,_0,_3,_3> *)local_70,
        (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
         *)local_70);
  local_40 = &f->center;
  local_70 = (undefined1  [8])&this->sumKPos;
  local_48 = &f->K;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  lazyAssign<Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Matrix<double,3,1,0,3,1>const&,6>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_68,
             (DenseBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
              *)&local_48);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Matrix<double,3,1,0,3,1>const&,6>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->sumKPos,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>_>
              *)local_70);
  return;
}

Assistant:

void VCClusterAniso::delItemAdditionalAct(VCFace* f) {
	sumK = sumK - f->K;
	sumKPos = sumKPos - f->K * f->center;
}